

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O2

Message * __thiscall testing::Message::operator<<(Message *this,char **pointer)

{
  char *pcVar1;
  
  pcVar1 = "(null)";
  if (*pointer != (char *)0x0) {
    pcVar1 = *pointer;
  }
  std::operator<<((ostream *)((this->ss_).ptr_ + 0x10),pcVar1);
  return this;
}

Assistant:

inline Message& operator <<(T* const& pointer) {  // NOLINT
    if (pointer == NULL) {
      *ss_ << "(null)";
    } else {
      *ss_ << pointer;
    }
    return *this;
  }